

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

bool __thiscall LinearNE<2,_3,_0>::propagate(LinearNE<2,_3,_0> *this)

{
  ulong uVar1;
  long *plVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  IntView<2> *pIVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  anon_union_8_2_743a5d44_for_Reason_0 aVar15;
  long lVar16;
  long lVar17;
  Clause *c;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  if ((this->num_unfixed).v == 0) {
    if ((this->sum_fixed).v != 0) {
      return true;
    }
    if (so.lazy) {
      iVar5 = this->sz;
      local_38._pt = (Clause *)malloc((long)iVar5 * 4 + 0xc);
      *(uint *)local_38._pt = (iVar5 + 1) * 0x100 | 2;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
      aVar15 = local_38;
      if (0 < this->sz) {
        lVar17 = 0;
        uVar13 = 1;
        do {
          iVar5 = (**(code **)(**(long **)((long)&this->x->var + lVar17) + 0x50))();
          if (*(uint *)aVar15._pt >> 8 <= uVar13) goto LAB_001a720a;
          (aVar15._pt)->data[uVar13].x = iVar5;
          lVar17 = lVar17 + 0x10;
          bVar3 = (long)uVar13 < (long)this->sz;
          uVar13 = uVar13 + 1;
        } while (bVar3);
      }
    }
    else {
      aVar15._pt = (Clause *)0x0;
    }
    SAT::cEnqueue(&sat,(Lit)(((this->r).s ^ 1) + (this->r).v * 2),(Reason)aVar15);
    return sat.confl == (Clause *)0x0;
  }
  uVar13 = 0;
  lVar17 = 0;
  do {
    lVar16 = lVar17;
    lVar11 = *(long *)((long)&this->x->var + lVar16);
    lVar17 = lVar16 + 0x10;
    uVar13 = uVar13 - 1;
  } while (*(int *)(lVar11 + 0xc) == *(int *)(lVar11 + 0x10));
  iVar5 = (int)~uVar13;
  if (iVar5 < *(int *)&(this->super_Propagator).field_0x14) {
    lVar12 = -(this->sum_fixed).v;
    lVar9 = (long)*(int *)((long)&this->x->a + lVar16);
    lVar8 = lVar12 / lVar9;
    if (lVar12 % lVar9 != 0) {
      return true;
    }
    if (lVar8 < *(int *)(lVar11 + 0xc)) {
      return true;
    }
    if (*(int *)(lVar11 + 0x10) < lVar8) {
      return true;
    }
    if ((*(long *)(lVar11 + 0x28) != 0) && (*(char *)(*(long *)(lVar11 + 0x28) + lVar8) == '\0')) {
      return true;
    }
  }
  else {
    bVar3 = IntView<3>::indomain((IntView<3> *)((long)&this->y->var + lVar16),-(this->sum_fixed).v);
    if (!bVar3) {
      return true;
    }
  }
  if (so.lazy == true) {
    iVar7 = this->sz;
    local_38._pt = (Clause *)malloc((long)iVar7 * 4 + 8);
    *(uint *)local_38._pt = iVar7 << 8 | 2;
    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
    aVar15 = local_38;
    if (lVar17 != 0x10) {
      lVar11 = 0;
      uVar14 = 0;
      do {
        uVar6 = (**(code **)(**(long **)((long)&this->x->var + lVar11) + 0x50))();
        uVar1 = uVar14 + 1;
        if (*(uint *)aVar15._pt >> 8 <= uVar1) goto LAB_001a720a;
        ((uint *)(aVar15._a + 8))[uVar14] = uVar6;
        lVar11 = lVar11 + 0x10;
        uVar14 = uVar1;
      } while (~uVar13 != uVar1);
    }
    uVar13 = -uVar13;
    if ((int)uVar13 < this->sz) {
      do {
        iVar7 = (**(code **)(**(long **)((long)&this->x->var + lVar17) + 0x50))();
        if (*(uint *)aVar15._pt >> 8 <= uVar13) {
LAB_001a720a:
          abort();
        }
        (aVar15._pt)->data[uVar13].x = iVar7;
        uVar13 = uVar13 + 1;
        lVar17 = lVar17 + 0x10;
      } while ((int)uVar13 < this->sz);
    }
  }
  else {
    aVar15._pt = (Clause *)0x0;
  }
  if (iVar5 < *(int *)&(this->super_Propagator).field_0x14) {
    lVar11 = -(this->sum_fixed).v;
    pIVar10 = this->x;
    lVar12 = (long)*(int *)((long)&pIVar10->a + lVar16);
    lVar17 = lVar11 / lVar12;
    if (lVar11 % lVar12 != 0) {
      return true;
    }
  }
  else {
    lVar17 = -(this->sum_fixed).v;
    pIVar10 = (IntView<2> *)this->y;
    lVar11 = (long)*(int *)((long)&pIVar10->a + lVar16);
    if (lVar17 % lVar11 != 0) {
      return true;
    }
    lVar17 = -(lVar17 / lVar11);
  }
  plVar2 = *(long **)((long)&pIVar10->var + lVar16);
  cVar4 = (**(code **)(*plVar2 + 0x88))(plVar2,lVar17,aVar15._pt,1);
  if (cVar4 != '\0') {
    return true;
  }
  return false;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		assert(num_unfixed <= 1);

		if (num_unfixed == 0) {
			if (sum_fixed == 0) {
				Clause* m_r = nullptr;
				if (so.lazy) {
					m_r = Reason_new(sz + 1);
					for (int i = 0; i < sz; i++) {
						(*m_r)[i + 1] = x[i].getValLit();
					}
				}
				return r.setVal(false, m_r);
			}
			return true;
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		assert(num_unfixed == 1);

		int k = 0;
		while (x[k].isFixed()) {
			k++;
		}
		assert(k < sz);
		for (int i = k + 1; i < sz; i++) {
			assert(x[i].isFixed());
		}

		if ((k < sp && x[k].remValNotR(-sum_fixed)) || (k >= sp && y[k].remValNotR(-sum_fixed))) {
			Clause* m_r = nullptr;
			if (so.lazy) {
				m_r = Reason_new(sz + R);
				for (int i = 0; i < k; i++) {
					(*m_r)[i + 1] = x[i].getValLit();
				}
				for (int i = k + 1; i < sz; i++) {
					(*m_r)[i] = x[i].getValLit();
				}
				if (R != 0) {
					(*m_r)[sz] = r.getValLit();
				}
			}
			if (k < sp) {
				if (!x[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			} else {
				if (!y[k].remVal(-sum_fixed, m_r)) {
					return false;
				}
			}
		}

		return true;
	}